

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *str;
  Message *pMVar2;
  long in_FS_OFFSET;
  char *str_val;
  Int32 default_val_local;
  Int32 local_1c;
  char *pcStack_18;
  Int32 result;
  char *var_local;
  
  var_local = *(char **)(in_FS_OFFSET + 0x28);
  pcStack_18 = var;
  str = posix::GetEnv(var);
  str_val._4_4_ = default_val;
  if (str != (char *)0x0) {
    Message::Message((Message *)&default_val_local);
    pMVar2 = Message::operator<<((Message *)&default_val_local,
                                 (char (*) [35])"The value of environment variable ");
    pMVar2 = Message::operator<<(pMVar2,&stack0xffffffffffffffe8);
    bVar1 = ParseInt32(pMVar2,str,&local_1c);
    Message::~Message((Message *)&default_val_local);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      exit(1);
    }
    str_val._4_4_ = local_1c;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != var_local) {
    __stack_chk_fail();
  }
  return str_val._4_4_;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}